

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O1

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,double *f)

{
  double dVar1;
  FloatingPointPrecision FVar2;
  qint64 qVar3;
  long in_FS_OFFSET;
  float d;
  float local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (0xb < this->ver) {
    FVar2 = floatingPointPrecision(this);
    if (FVar2 == SinglePrecision) {
      local_24 = -NAN;
      operator>>(this,&local_24);
      *f = (double)local_24;
      goto LAB_002f015c;
    }
  }
  *f = 0.0;
  if (this->dev != (QIODevice *)0x0) {
    qVar3 = readBlock(this,(char *)f,8);
    if (qVar3 == 8) {
      if (this->noswap == false) {
        dVar1 = *f;
        *f = (double)((ulong)dVar1 >> 0x38 | ((ulong)dVar1 & 0xff000000000000) >> 0x28 |
                      ((ulong)dVar1 & 0xff0000000000) >> 0x18 | ((ulong)dVar1 & 0xff00000000) >> 8 |
                      ((ulong)dVar1 & 0xff000000) << 8 | ((ulong)dVar1 & 0xff0000) << 0x18 |
                      ((ulong)dVar1 & 0xff00) << 0x28 | (long)dVar1 << 0x38);
      }
    }
    else {
      *f = 0.0;
    }
  }
LAB_002f015c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &QDataStream::operator>>(double &f)
{
    if (version() >= QDataStream::Qt_4_6
        && floatingPointPrecision() == QDataStream::SinglePrecision) {
        float d;
        *this >> d;
        f = d;
        return *this;
    }

    f = 0.0;
    CHECK_STREAM_PRECOND(*this)
    if (readBlock(reinterpret_cast<char *>(&f), 8) != 8) {
        f = 0.0;
    } else {
        if (!noswap) {
            union {
                double val1;
                quint64 val2;
            } x;
            x.val2 = qbswap(*reinterpret_cast<quint64 *>(&f));
            f = x.val1;
        }
    }
    return *this;
}